

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrismaticJoint.cpp
# Opt level: O3

void __thiscall
iDynTree::PrismaticJoint::computeChildVel
          (PrismaticJoint *this,VectorDynSize *jntPos,VectorDynSize *jntVel,LinkVelArray *linkVels,
          LinkIndex child,LinkIndex parent)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Twist *this_00;
  double dVar2;
  SpatialMotionVector vj;
  SpatialMotionVector S;
  Twist local_120 [48];
  Transform local_f0 [48];
  Twist local_c0 [48];
  SpatialMotionVector local_90;
  undefined1 local_60 [48];
  
  iVar1 = (*(this->super_MovableJointImpl1).super_IJoint._vptr_IJoint[0x18])();
  dVar2 = (double)iDynTree::VectorDynSize::operator()(jntVel,CONCAT44(extraout_var,iVar1));
  iVar1 = (*(this->super_MovableJointImpl1).super_IJoint._vptr_IJoint[10])(this,jntPos,child,parent)
  ;
  (*(this->super_MovableJointImpl1).super_IJoint._vptr_IJoint[0xc])
            (local_60,this,0,child,LINK_INVALID_INDEX);
  iDynTree::SpatialMotionVector::operator*(&local_90,dVar2);
  LinkVelArray::operator()(linkVels,parent);
  iDynTree::Transform::operator*(local_f0,(Twist *)CONCAT44(extraout_var_00,iVar1));
  iDynTree::Twist::Twist(local_120,&local_90);
  iDynTree::Twist::operator+(local_c0,(Twist *)local_f0);
  this_00 = LinkVelArray::operator()(linkVels,child);
  iDynTree::Twist::operator=(this_00,local_c0);
  return;
}

Assistant:

void PrismaticJoint::computeChildVel(const VectorDynSize & jntPos,
                                    const VectorDynSize & jntVel,
                                          LinkVelArray & linkVels,
                                    const LinkIndex child, const LinkIndex parent) const
{
    double ddist = jntVel(this->getDOFsOffset());

    const Transform & child_X_parent = this->getTransform(jntPos,child,parent);

    // Propagate twist and spatial acceleration: for a prismatic joint (as for any 1 dof joint)
    // we implement equation 5.14 and 5.15 of Feathestone RBDA, 2008
    iDynTree::SpatialMotionVector S = this->getMotionSubspaceVector(0,child);

    SpatialMotionVector vj = S*ddist;
    linkVels(child) = child_X_parent*linkVels(parent) + vj;

    return;
}